

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * increment(Bigint *b)

{
  int iVar1;
  ULong UVar2;
  ULong *pUVar3;
  Bigint *b1;
  ULong *xe;
  ULong *x;
  Bigint *b_local;
  
  iVar1 = b->wds;
  xe = b->x;
  do {
    if (*xe != 0xffffffff) {
      *xe = *xe + 1;
      return b;
    }
    pUVar3 = xe + 1;
    *xe = 0;
    xe = pUVar3;
  } while (pUVar3 < b->x + iVar1);
  x = (ULong *)b;
  if (b->maxwds <= b->wds) {
    x = (ULong *)Balloc(b->k + 1);
    memcpy(&((Bigint *)x)->sign,&b->sign,(long)b->wds * 4 + 8);
    Bfree(b);
  }
  UVar2 = x[5];
  x[5] = UVar2 + 1;
  x[(long)(int)UVar2 + 6] = 1;
  return (Bigint *)x;
}

Assistant:

static Bigint *
increment(Bigint *b MTd)
{
	ULong *x, *xe;
	Bigint *b1;

	x = b->x;
	xe = x + b->wds;
	do {
		if (*x < (ULong)0xffffffffL) {
			++*x;
			return b;
			}
		*x++ = 0;
		} while(x < xe);
	{
		if (b->wds >= b->maxwds) {
			b1 = Balloc(b->k+1 MTa);
			Bcopy(b1,b);
			Bfree(b MTa);
			b = b1;
			}
		b->x[b->wds++] = 1;
		}
	return b;
	}